

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O0

proficiency_type * __thiscall CProficiencies::GetProficiency(CProficiencies *this,char *profname)

{
  bool bVar1;
  size_type __n;
  const_reference __src;
  proficiency_type *in_RDX;
  proficiency_type *in_RDI;
  difference_type idx;
  __normal_iterator<const_proficiency_type_*,_std::vector<proficiency_type,_std::allocator<proficiency_type>_>_>
  it;
  proficiency_type result;
  vector<proficiency_type,_std::allocator<proficiency_type>_> *in_stack_ffffffffffffff78;
  proficiency_type *__lhs;
  anon_class_8_1_ac30eee2_for__M_pred in_stack_ffffffffffffff98;
  __normal_iterator<const_proficiency_type_*,_std::vector<proficiency_type,_std::allocator<proficiency_type>_>_>
  in_stack_ffffffffffffffa0;
  undefined1 local_38 [40];
  __normal_iterator<const_proficiency_type_*,_std::vector<proficiency_type,_std::allocator<proficiency_type>_>_>
  local_10;
  
  __lhs = in_RDI;
  local_10._M_current = in_RDX;
  memcpy(local_38,&PTR_psn_none_0092eb70,0x28);
  if (local_10._M_current == (proficiency_type *)0x0) {
    memcpy(__lhs,local_38,0x28);
  }
  else {
    std::vector<proficiency_type,_std::allocator<proficiency_type>_>::begin
              (in_stack_ffffffffffffff78);
    std::vector<proficiency_type,_std::allocator<proficiency_type>_>::end(in_stack_ffffffffffffff78)
    ;
    std::
    find_if<__gnu_cxx::__normal_iterator<proficiency_type_const*,std::vector<proficiency_type,std::allocator<proficiency_type>>>,CProficiencies::GetProficiency(char*)::__0>
              (local_10,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    std::vector<proficiency_type,_std::allocator<proficiency_type>_>::end(in_stack_ffffffffffffff78)
    ;
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<const_proficiency_type_*,_std::vector<proficiency_type,_std::allocator<proficiency_type>_>_>
                        *)__lhs,(__normal_iterator<const_proficiency_type_*,_std::vector<proficiency_type,_std::allocator<proficiency_type>_>_>
                                 *)in_stack_ffffffffffffff78);
    if (bVar1) {
      memcpy(__lhs,local_38,0x28);
    }
    else {
      std::vector<proficiency_type,_std::allocator<proficiency_type>_>::begin
                (in_stack_ffffffffffffff78);
      __n = __gnu_cxx::operator-
                      ((__normal_iterator<const_proficiency_type_*,_std::vector<proficiency_type,_std::allocator<proficiency_type>_>_>
                        *)__lhs,(__normal_iterator<const_proficiency_type_*,_std::vector<proficiency_type,_std::allocator<proficiency_type>_>_>
                                 *)in_stack_ffffffffffffff78);
      __src = std::vector<proficiency_type,_std::allocator<proficiency_type>_>::operator[]
                        (&prof_table,__n);
      memcpy(__lhs,__src,0x28);
    }
  }
  return in_RDI;
}

Assistant:

proficiency_type CProficiencies::GetProficiency(char* profname)
{
	proficiency_type result = { &psn_none, "", 0, 0, nullptr, PFLAGS_NONE };
	if(profname == nullptr)
		return result;

	auto it = std::find_if(prof_table.begin(), prof_table.end(), [profname] (auto prof) {
		return prof.name != nullptr && !str_cmp(prof.name, profname);
	});

	if (it == prof_table.end())
		return result;
	
	auto idx = it - prof_table.begin();
	return prof_table[idx];
}